

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkTryNewMiter(char *pFileName0,char *pFileName1)

{
  int iVar1;
  Cnf_Dat_t *p;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk_01;
  Gia_Man_t *pGia;
  int *pVars;
  sat_solver *s;
  int *piVar3;
  uint nVars;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int Lit;
  int local_54;
  Cnf_Dat_t *local_50;
  long local_48;
  Vec_Ptr_t *local_40;
  void **local_38;
  
  pNtk = Io_Read(pFileName0,IO_FILE_VERILOG,1,0);
  pNtk_00 = Io_Read(pFileName1,IO_FILE_VERILOG,1,0);
  pNtk1 = Abc_NtkStrash(pNtk,1,1,0);
  pNtk2 = Abc_NtkStrash(pNtk_00,1,1,0);
  pNtk_01 = Abc_NtkMiter(pNtk1,pNtk2,1,0,0,1);
  pGia = Abc_NtkClpGia(pNtk_01);
  if (pNtk->vCis->nSize != pNtk_00->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x4c1,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
  }
  if (pNtk->vCos->nSize != pNtk_00->vCos->nSize) {
    __assert_fail("Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x4c2,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
  }
  Abc_NtkDelete(pNtk);
  Abc_NtkDelete(pNtk_00);
  Abc_NtkDelete(pNtk1);
  Abc_NtkDelete(pNtk2);
  Abc_NtkDelete(pNtk_01);
  lVar6 = (long)pGia->vCos->nSize - (long)pGia->nRegs;
  local_40 = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = (int)lVar6;
  iVar2 = 8;
  if (6 < iVar5 - 1U) {
    iVar2 = iVar5;
  }
  local_40->nSize = 0;
  local_40->nCap = iVar2;
  if (iVar2 == 0) {
    local_38 = (void **)0x0;
  }
  else {
    local_38 = (void **)malloc((long)iVar2 << 3);
  }
  local_40->pArray = local_38;
  local_40->nSize = iVar5;
  local_48 = lVar6;
  memset(local_38,0,lVar6 * 8);
  local_50 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,0,0,0);
  iVar5 = pGia->vCis->nSize;
  iVar2 = pGia->nRegs;
  nVars = iVar5 - iVar2;
  iVar1 = local_50->nVars;
  pVars = (int *)malloc((long)(int)nVars * 4);
  p = local_50;
  if (0 < (int)nVars) {
    uVar4 = 0;
    do {
      pVars[uVar4] = (int)uVar4 + ((iVar1 + iVar2) - iVar5);
      uVar4 = uVar4 + 1;
    } while (nVars != uVar4);
  }
  s = (sat_solver *)Cnf_DataWriteIntoSolver(local_50,1,0);
  Cnf_DataFree(p);
  if (pGia->nRegs < pGia->vCos->nSize) {
    local_50 = (Cnf_Dat_t *)(long)(int)local_48;
    iVar5 = 2;
    uVar4 = 0;
    do {
      local_54 = iVar5;
      iVar2 = sat_solver_solve(s,&local_54,(lit *)&local_50,100000,0,0,0);
      if (iVar2 != -1) {
        if (iVar2 == 0) {
          __assert_fail("status != l_Undef",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                        ,0x4d5,"Vec_Ptr_t *Abc_NtkTryNewMiter(char *, char *)");
        }
        piVar3 = Sat_SolverGetModel(s,pVars,nVars);
        if ((long)local_50 <= (long)uVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        local_38[uVar4] = piVar3;
        printf("Output %3d (out of %3d) is SAT.\n",uVar4 & 0xffffffff,
               (ulong)(uint)(pGia->vCos->nSize - pGia->nRegs));
      }
      uVar4 = uVar4 + 1;
      iVar5 = iVar5 + 2;
    } while ((long)uVar4 < (long)pGia->vCos->nSize - (long)pGia->nRegs);
  }
  Gia_ManStop(pGia);
  sat_solver_delete(s);
  if (pVars != (int *)0x0) {
    free(pVars);
  }
  return local_40;
}

Assistant:

Vec_Ptr_t * Abc_NtkTryNewMiter( char * pFileName0, char * pFileName1 )
{
    extern void * Cnf_DataWriteIntoSolver2( Cnf_Dat_t * p, int nFrames, int fInit );
    int i, nVars, * pVars, iCiVarBeg, iCoVarBeg = 1, nBTLimit = 100000;
    sat_solver * pSat  = NULL;
    Cnf_Dat_t * pCnf   = NULL;
    Vec_Ptr_t * vCexes = NULL;
    Abc_Ntk_t * pNtk1  = Io_Read( pFileName0, IO_FILE_VERILOG, 1, 0 );
    Abc_Ntk_t * pNtk2  = Io_Read( pFileName1, IO_FILE_VERILOG, 1, 0 );
    Abc_Ntk_t * pNtk1_ = Abc_NtkStrash( pNtk1, 1, 1, 0 );
    Abc_Ntk_t * pNtk2_ = Abc_NtkStrash( pNtk2, 1, 1, 0 );
    Abc_Ntk_t * pMiter = Abc_NtkMiter( pNtk1_, pNtk2_, 1, 0, 0, 1 );
    Gia_Man_t * pGia = Abc_NtkClpGia( pMiter );
    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkCoNum(pNtk1) == Abc_NtkCoNum(pNtk2) );
    Abc_NtkDelete( pNtk1 );
    Abc_NtkDelete( pNtk2 );
    Abc_NtkDelete( pNtk1_ );
    Abc_NtkDelete( pNtk2_ );
    Abc_NtkDelete( pMiter );
    vCexes = Vec_PtrStart( Gia_ManPoNum(pGia) );
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 0, 0, 0 );
    nVars = Gia_ManPiNum(pGia);
    iCiVarBeg = pCnf->nVars - nVars;
    pVars = ABC_ALLOC( int, nVars );
    for ( i = 0; i < nVars; i++ )
        pVars[i] = iCiVarBeg + i;
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0);
    Cnf_DataFree( pCnf );
    for ( i = 0; i < Gia_ManPoNum(pGia); i++ )
    {
        int Lit = Abc_Var2Lit( iCoVarBeg + i, 0 );
        int status = sat_solver_solve( pSat, &Lit, &Lit + 1, nBTLimit, 0, 0, 0 );
        assert( status != l_Undef );
        if ( status == l_False )
            continue;
        Vec_PtrWriteEntry( vCexes, i, Sat_SolverGetModel(pSat, pVars, nVars) );
        printf( "Output %3d (out of %3d) is SAT.\n", i, Gia_ManPoNum(pGia) );
    }
    Gia_ManStop( pGia );
    sat_solver_delete( pSat );
    ABC_FREE( pVars );
    return vCexes;
}